

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

void __thiscall
leveldb::VersionSet::GetRange2
          (VersionSet *this,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs1,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs2,
          InternalKey *smallest,InternalKey *largest)

{
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> all;
  void *local_40;
  undefined8 local_38;
  
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
            ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)&local_40,
             inputs1);
  std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<leveldb::FileMetaData*const*,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>>
            ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)&local_40,
             local_38,(inputs2->
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      )._M_impl.super__Vector_impl_data._M_start,
             (inputs2->
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  GetRange(this,(vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                &local_40,smallest,largest);
  if (local_40 != (void *)0x0) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

void VersionSet::GetRange2(const std::vector<FileMetaData*>& inputs1,
                           const std::vector<FileMetaData*>& inputs2,
                           InternalKey* smallest, InternalKey* largest) {
  std::vector<FileMetaData*> all = inputs1;
  all.insert(all.end(), inputs2.begin(), inputs2.end());
  GetRange(all, smallest, largest);
}